

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

XmlStringRef * __thiscall
QXmlStreamReaderPrivate::namespaceForPrefix
          (XmlStringRef *__return_storage_ptr__,QXmlStreamReaderPrivate *this,QStringView prefix)

{
  undefined4 *puVar1;
  NamespaceDeclaration *pNVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  storage_type_conflict *psVar6;
  bool bVar7;
  storage_type_conflict *psVar8;
  XmlStringRef *lhs;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView a;
  QString local_68;
  QString local_50;
  long local_38;
  
  lhs = (XmlStringRef *)prefix.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  psVar6 = (storage_type_conflict *)
           ((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos * 0x30);
  do {
    psVar8 = psVar6;
    if (psVar8 == (storage_type_conflict *)0xffffffffffffffd0) goto LAB_003a146b;
    rhs.m_data = psVar8;
    rhs.m_size = (qsizetype)prefix.m_data;
    bVar7 = QtPrivate::operator==((QtPrivate *)((long)psVar8 + (long)pNVar2),lhs,rhs);
    psVar6 = psVar8 + -0x18;
  } while (!bVar7);
  __return_storage_ptr__->m_size =
       *(qsizetype *)((long)&pNVar2[1].namespaceUri.m_size + (long)psVar6);
  puVar1 = (undefined4 *)((long)&pNVar2[1].namespaceUri.m_string + (long)psVar6);
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  *(undefined4 *)&__return_storage_ptr__->m_string = *puVar1;
  *(undefined4 *)((long)&__return_storage_ptr__->m_string + 4) = uVar3;
  *(undefined4 *)&__return_storage_ptr__->m_pos = uVar4;
  *(undefined4 *)((long)&__return_storage_ptr__->m_pos + 4) = uVar5;
  if (psVar8 == (storage_type_conflict *)0xffffffffffffffd0) {
LAB_003a146b:
    if (lhs != (XmlStringRef *)0x0 && (this->field_0x3a9 & 0x10) != 0) {
      QCoreApplication::translate
                (&local_68,"QXmlStream","Namespace prefix \'%1\' not declared",(char *)0x0,-1);
      a.m_size = (ulong)lhs | 0x8000000000000000;
      a.field_0.m_data = prefix.m_data;
      QString::arg_impl(&local_50,&local_68,a,0,(QChar)0x20);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,&local_50);
      this->type = Invalid;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    __return_storage_ptr__->m_string = (QString *)0x0;
    __return_storage_ptr__->m_pos = 0;
    __return_storage_ptr__->m_size = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

XmlStringRef QXmlStreamReaderPrivate::namespaceForPrefix(QStringView prefix)
{
     for (const NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
         if (namespaceDeclaration.prefix == prefix) {
             return namespaceDeclaration.namespaceUri;
         }
     }

#if 1
     if (namespaceProcessing && !prefix.isEmpty())
         raiseWellFormedError(QXmlStream::tr("Namespace prefix '%1' not declared").arg(prefix));
#endif

     return XmlStringRef();
}